

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_parse.c
# Opt level: O3

void ParseLFP(EeePLFPDataBlock_t *dblock,int size)

{
  ulong uVar1;
  
  printf("   LFP block:\n      Interface: %d\n",(ulong)dblock->Interface);
  printf("      Raw Data:\n      ");
  if (0 < (int)(size - 4U)) {
    uVar1 = 0;
    do {
      if ((uVar1 & 0xf) == 0) {
        printf("\n      ");
      }
      printf("%02X ",(ulong)dblock->RawData[uVar1]);
      uVar1 = uVar1 + 1;
    } while (size - 4U != uVar1);
  }
  putchar(10);
  return;
}

Assistant:

void ParseLFP(EeePLFPDataBlock_t *dblock, int size)
{
	int raw_size = size - FIELD_OFFSET(EeePLFPDataBlock_t, RawData);
	printf("   LFP block:\n      Interface: %d\n", dblock->Interface);
	printf("      Raw Data:\n      ");
	for( int i = 0; i < raw_size; i++ ) {
		if( i%16 == 0) {
			printf("\n      ");
		}
		printf("%02X ", dblock->RawData[i]);
	}
	printf("\n");
}